

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::GeneratedCodeInfo::ByteSizeLong(GeneratedCodeInfo *this)

{
  long lVar1;
  Rep *pRVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  void **ppvVar6;
  
  sVar5 = (size_t)(this->annotation_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  lVar1 = sVar5 * 8;
  for (lVar4 = 0; lVar1 - lVar4 != 0; lVar4 = lVar4 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::GeneratedCodeInfo_Annotation>
                      (*(GeneratedCodeInfo_Annotation **)((long)ppvVar6 + lVar4));
    sVar5 = sVar5 + sVar3;
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar5;
    return sVar5;
  }
  sVar5 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar5,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t GeneratedCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  total_size += 1UL * this->_internal_annotation_size();
  for (const auto& msg : this->annotation_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}